

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O0

bool UseNonStaticTemplate(ExpressionTranslateContext *ctx,FunctionData *function)

{
  bool bVar1;
  FunctionData *function_local;
  ExpressionTranslateContext *ctx_local;
  
  if (((function->scope == ctx->ctx->globalScope) ||
      (function->scope->ownerNamespace != (NamespaceData *)0x0)) ||
     (function->scope->ownerType != (TypeBase *)0x0)) {
    if (*(function->name->name).begin == '$') {
      ctx_local._7_1_ = false;
    }
    else if ((function->isHidden & 1U) == 0) {
      bVar1 = ExpressionContext::IsGenericInstance(ctx->ctx,function);
      if (bVar1) {
        ctx_local._7_1_ = true;
      }
      else {
        ctx_local._7_1_ = false;
      }
    }
    else {
      ctx_local._7_1_ = false;
    }
  }
  else {
    ctx_local._7_1_ = false;
  }
  return ctx_local._7_1_;
}

Assistant:

bool UseNonStaticTemplate(ExpressionTranslateContext &ctx, FunctionData *function)
{
	if(function->scope != ctx.ctx.globalScope && !function->scope->ownerNamespace && !function->scope->ownerType)
		return false;
	else if(*function->name->name.begin == '$')
		return false;
	else if(function->isHidden)
		return false;
	else if(ctx.ctx.IsGenericInstance(function))
		return true;

	return false;
}